

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarks.c
# Opt level: O3

void evaluate(Benchmarks *bench,Arguments *args)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  timespec ts;
  long local_30;
  long local_28;
  
  if (0 < args->count) {
    timespec_get(&local_30,1);
    dVar4 = (double)local_30 * 1000000000.0 + (double)local_28;
    uVar2 = (ulong)dVar4;
    dVar10 = (((double)CONCAT44(0x45300000,(int)(bench->sum >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)bench->sum) - 4503599627370496.0)) /
             (double)args->count;
    lVar3 = ((long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2) -
            bench->total_start;
    uVar2 = bench->squared_sum / (ulong)(long)args->count;
    auVar5._8_4_ = (int)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) - dVar10 * dVar10;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    iVar1 = args->count;
    auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = 0x45300000;
    dVar9 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
    puts("\n============ RESULTS ================");
    printf("Message size:       %d\n",(ulong)(uint)args->size);
    printf("Message count:      %d\n",(ulong)(uint)args->count);
    printf("Total duration:     %.3f\tms\n",dVar9 / 1000000.0);
    printf("Average duration:   %.3f\tus\n",dVar10 / 1000.0);
    auVar7._0_8_ = (double)CONCAT44(0x43300000,(int)bench->minimum);
    auVar7._8_4_ = (int)(bench->minimum >> 0x20);
    auVar7._12_4_ = 0x45300000;
    printf("Minimum duration:   %.3f\tus\n",
           ((auVar7._8_8_ - 1.9342813113834067e+25) + (auVar7._0_8_ - 4503599627370496.0)) / 1000.0)
    ;
    auVar8._0_8_ = (double)CONCAT44(0x43300000,(int)bench->maximum);
    auVar8._8_4_ = (int)(bench->maximum >> 0x20);
    auVar8._12_4_ = 0x45300000;
    printf("Maximum duration:   %.3f\tus\n",
           ((auVar8._8_8_ - 1.9342813113834067e+25) + (auVar8._0_8_ - 4503599627370496.0)) / 1000.0)
    ;
    printf("Standard deviation: %.3f\tus\n",dVar4 / 1000.0);
    printf("Message rate:       %d\tmsg/s\n",
           (ulong)(uint)(int)((double)iVar1 / (dVar9 / 1000000000.0)));
    puts("=====================================");
    return;
  }
  __assert_fail("args->count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]ipc-bench/source/common/benchmarks.c"
                ,0x2f,"void evaluate(Benchmarks *, Arguments *)");
}

Assistant:

void evaluate(Benchmarks* bench, Arguments* args) {
	assert(args->count > 0);
	const bench_t total_time = now() - bench->total_start;
	const double average = ((double)bench->sum) / args->count;

	double sigma = bench->squared_sum / args->count;
	sigma = sqrt(sigma - (average * average));

	int messageRate = (int)(args->count / (total_time / 1e9));

	printf("\n============ RESULTS ================\n");
	printf("Message size:       %d\n", args->size);
	printf("Message count:      %d\n", args->count);
	printf("Total duration:     %.3f\tms\n", total_time / 1e6);
	printf("Average duration:   %.3f\tus\n", average / 1000.0);
	printf("Minimum duration:   %.3f\tus\n", bench->minimum / 1000.0);
	printf("Maximum duration:   %.3f\tus\n", bench->maximum / 1000.0);
	printf("Standard deviation: %.3f\tus\n", sigma / 1000.0);
	printf("Message rate:       %d\tmsg/s\n", messageRate);
	printf("=====================================\n");
}